

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimized.cpp
# Opt level: O3

void anon_unknown.dwarf_2761c7::validatePixels
               (int *pImageHeight,int *pImageWidth,Array2D<Imath_3_2::half> *pPixels,int pNbChannels
               ,bool pIsLeft)

{
  Array2D<Imath_3_2::half> *pAVar1;
  long lVar2;
  int iVar3;
  ostream *poVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  half *phVar8;
  half rgbaValue [4];
  half local_70;
  half local_6e;
  half local_6c;
  Array2D<Imath_3_2::half> *local_68;
  long local_60;
  ulong local_58;
  long local_50;
  ulong local_48;
  long local_40;
  size_t local_38;
  
  if (0 < (int)pImageHeight) {
    phVar8 = pPixels->_data;
    local_38 = (ulong)(uint)pNbChannels * 2;
    local_58 = (ulong)pImageHeight & 0xffffffff;
    local_48 = (ulong)pImageWidth & 0xffffffff;
    local_40 = (long)pNbChannels * 2;
    local_50 = pPixels->_sizeY * 2;
    local_60 = 0;
    uVar7 = 0;
    local_68 = pPixels;
    do {
      if (0 < (int)pImageWidth) {
        lVar6 = 0;
        uVar5 = 0;
        do {
          generatePixel((int)uVar7,(int)uVar5,&local_70,pIsLeft);
          iVar3 = bcmp((void *)((long)&phVar8->_h + lVar6),&local_70,local_38);
          if (iVar3 != 0) {
            poVar4 = std::operator<<((ostream *)&std::cout,"ERROR at pixel [");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)uVar7);
            poVar4 = std::operator<<(poVar4,";");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)uVar5);
            poVar4 = std::operator<<(poVar4,"]");
            std::endl<char,std::char_traits<char>>(poVar4);
            poVar4 = std::operator<<((ostream *)&std::cout,"\tExpected [");
            poVar4 = (ostream *)::operator<<(poVar4,local_70);
            poVar4 = std::operator<<(poVar4,", ");
            poVar4 = (ostream *)::operator<<(poVar4,local_6e);
            poVar4 = std::operator<<(poVar4,", ");
            poVar4 = (ostream *)::operator<<(poVar4,local_6c);
            poVar4 = std::operator<<(poVar4,"] ");
            std::endl<char,std::char_traits<char>>(poVar4);
            poVar4 = std::operator<<((ostream *)&std::cout,"\tReceived [");
            lVar2 = local_60;
            pAVar1 = local_68;
            poVar4 = (ostream *)
                     ::operator<<(poVar4,(half)*(uint16_t *)
                                                ((long)&local_68->_data->_h +
                                                lVar6 + local_68->_sizeY * local_60));
            poVar4 = std::operator<<(poVar4,", ");
            poVar4 = (ostream *)
                     ::operator<<(poVar4,(half)*(uint16_t *)
                                                ((long)&pAVar1->_data[1]._h +
                                                pAVar1->_sizeY * lVar2 + lVar6));
            poVar4 = std::operator<<(poVar4,", ");
            poVar4 = (ostream *)
                     ::operator<<(poVar4,(half)*(uint16_t *)
                                                ((long)&pAVar1->_data[2]._h +
                                                lVar2 * pAVar1->_sizeY + lVar6));
            poVar4 = std::operator<<(poVar4,"]");
            std::endl<char,std::char_traits<char>>(poVar4);
            __assert_fail("retVal == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testOptimized.cpp"
                          ,0xb8,
                          "void (anonymous namespace)::validatePixels(const int &, const int &, Array2D<half> &, int, bool)"
                         );
          }
          uVar5 = uVar5 + 1;
          lVar6 = lVar6 + local_40;
        } while (local_48 != uVar5);
      }
      uVar7 = uVar7 + 1;
      local_60 = local_60 + 2;
      phVar8 = (half *)((long)&phVar8->_h + local_50);
    } while (uVar7 != local_58);
  }
  return;
}

Assistant:

void
validatePixels (
    const int&     pImageHeight,
    const int&     pImageWidth,
    Array2D<half>& pPixels,
    int            pNbChannels,
    bool           pIsLeft)
{
    for (int i = 0; i < pImageHeight; ++i)
    {
        for (int j = 0; j < pImageWidth; ++j)
        {
            int  retVal = -1;
            half rgbaValue[4];
            generatePixel (i, j, &rgbaValue[0], pIsLeft);

            retVal = memcmp (
                (void*) &pPixels[i][j * pNbChannels],
                (void*) &rgbaValue[0],
                pNbChannels * sizeof (half));

            if (retVal != 0)
            {
                cout << "ERROR at pixel [" << i << ";" << j << "]" << endl;
                cout << "\tExpected [" << rgbaValue[0] << ", " << rgbaValue[1]
                     << ", " << rgbaValue[2] << "] " << endl;

                cout << "\tReceived [" << pPixels[i][j * pNbChannels] << ", "
                     << pPixels[i][j * pNbChannels + 1] << ", "
                     << pPixels[i][j * pNbChannels + 2] << "]" << endl;
                assert (retVal == 0);
            }
        }
    }
}